

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::framebufferTextureLayer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 texture,int level,
          int layer)

{
  deBool dVar1;
  Type TVar2;
  deUint32 dVar3;
  TexTarget TVar4;
  float fVar5;
  float fVar6;
  Framebuffer *local_78;
  int local_64;
  AttachmentType AStack_60;
  int ndx_1;
  TexTarget local_58;
  int iStack_54;
  int local_50;
  int local_4c;
  Attachment *pAStack_48;
  int ndx;
  Attachment *fboAttachment;
  Framebuffer *pFStack_38;
  int bindingRefCount;
  Framebuffer *framebufferBinding;
  Texture *texObj;
  AttachmentPoint point;
  int layer_local;
  int level_local;
  deUint32 texture_local;
  deUint32 attachment_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  texObj._4_4_ = layer;
  point = level;
  layer_local = texture;
  level_local = attachment;
  texture_local = target;
  _attachment_local = this;
  if (attachment == 0x821a) {
    (*(this->super_Context)._vptr_Context[0x1f])
              (this,(ulong)target,0x8d00,(ulong)texture,(ulong)(uint)level,(ulong)(uint)layer);
    (*(this->super_Context)._vptr_Context[0x1f])
              (this,(ulong)texture_local,0x8d20,(ulong)(uint)layer_local,(ulong)point,
               (ulong)texObj._4_4_);
  }
  else {
    texObj._0_4_ = mapGLAttachmentPoint(attachment);
    framebufferBinding = (Framebuffer *)0x0;
    do {
      if (((texture_local != 0x8d40) && (texture_local != 0x8ca9)) && (texture_local != 0x8ca8)) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      if ((AttachmentPoint)texObj == ATTACHMENTPOINT_LAST) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    if ((texture_local == 0x8d40) || (texture_local == 0x8ca9)) {
      local_78 = this->m_drawFramebufferBinding;
    }
    else {
      local_78 = this->m_readFramebufferBinding;
    }
    pFStack_38 = local_78;
    do {
      if (pFStack_38 == (Framebuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    fboAttachment._4_4_ =
         (uint)(pFStack_38 == this->m_drawFramebufferBinding) +
         (uint)(pFStack_38 == this->m_readFramebufferBinding);
    if (layer_local != 0) {
      framebufferBinding =
           (Framebuffer *)rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,layer_local);
      do {
        if (framebufferBinding == (Framebuffer *)0x0) {
          setError(this,0x502);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      do {
        if (point != ATTACHMENTPOINT_COLOR0) {
          setError(this,0x501);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      do {
        TVar2 = rc::Texture::getType((Texture *)framebufferBinding);
        if (((TVar2 != TYPE_2D_ARRAY) &&
            (TVar2 = rc::Texture::getType((Texture *)framebufferBinding), TVar2 != TYPE_3D)) &&
           (TVar2 = rc::Texture::getType((Texture *)framebufferBinding),
           TVar2 != TYPE_CUBE_MAP_ARRAY)) {
          setError(this,0x502);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      TVar2 = rc::Texture::getType((Texture *)framebufferBinding);
      if ((TVar2 == TYPE_2D_ARRAY) ||
         (TVar2 = rc::Texture::getType((Texture *)framebufferBinding), TVar2 == TYPE_CUBE_MAP_ARRAY)
         ) {
        do {
          if (((int)texObj._4_4_ < 0) || (0x88fe < (int)texObj._4_4_)) {
            setError(this,0x501);
            return;
          }
          dVar1 = ::deGetFalse();
        } while (dVar1 != 0);
        do {
          if (((int)point < 0) ||
             (fVar5 = (float)(int)point, fVar6 = deFloatLog2(3379.0), fVar6 < fVar5)) {
            setError(this,0x501);
            return;
          }
          dVar1 = ::deGetFalse();
        } while (dVar1 != 0);
      }
      else {
        TVar2 = rc::Texture::getType((Texture *)framebufferBinding);
        if (TVar2 == TYPE_3D) {
          do {
            if (((int)texObj._4_4_ < 0) || (0x8072 < (int)texObj._4_4_)) {
              setError(this,0x501);
              return;
            }
            dVar1 = ::deGetFalse();
          } while (dVar1 != 0);
          do {
            if (((int)point < 0) ||
               (fVar5 = (float)(int)point, fVar6 = deFloatLog2(32883.0), fVar6 < fVar5)) {
              setError(this,0x501);
              return;
            }
            dVar1 = ::deGetFalse();
          } while (dVar1 != 0);
        }
      }
    }
    pAStack_48 = rc::Framebuffer::getAttachment(pFStack_38,(AttachmentPoint)texObj);
    for (local_4c = 0; local_4c < fboAttachment._4_4_; local_4c = local_4c + 1) {
      releaseFboAttachmentReference(this,pAStack_48);
    }
    rc::Framebuffer::Attachment::Attachment((Attachment *)&stack0xffffffffffffffa0);
    pAStack_48->type = AStack_60;
    pAStack_48->name = ndx_1;
    pAStack_48->texTarget = local_58;
    pAStack_48->level = iStack_54;
    pAStack_48->layer = local_50;
    if (framebufferBinding != (Framebuffer *)0x0) {
      pAStack_48->type = ATTACHMENTTYPE_TEXTURE;
      dVar3 = rc::NamedObject::getName(&framebufferBinding->super_NamedObject);
      pAStack_48->name = dVar3;
      TVar2 = rc::Texture::getType((Texture *)framebufferBinding);
      TVar4 = texLayeredTypeToTarget(TVar2);
      pAStack_48->texTarget = TVar4;
      pAStack_48->level = point;
      pAStack_48->layer = texObj._4_4_;
      for (local_64 = 0; local_64 < fboAttachment._4_4_; local_64 = local_64 + 1) {
        acquireFboAttachmentReference(this,pAStack_48);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTextureLayer (deUint32 target, deUint32 attachment, deUint32 texture, int level, int layer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTextureLayer(target, GL_DEPTH_ATTACHMENT,	texture, level, layer);
		framebufferTextureLayer(target, GL_STENCIL_ATTACHMENT,	texture, level, layer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			RC_IF_ERROR(texObj->getType() != Texture::TYPE_2D_ARRAY			&&
						texObj->getType() != Texture::TYPE_3D				&&
						texObj->getType() != Texture::TYPE_CUBE_MAP_ARRAY,				GL_INVALID_OPERATION,	RC_RET_VOID);

			if (texObj->getType() == Texture::TYPE_2D_ARRAY || texObj->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_ARRAY_TEXTURE_LAYERS),		GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
			else if	(texObj->getType() == Texture::TYPE_3D)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_3D_TEXTURE_SIZE),				GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_3D_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= texLayeredTypeToTarget(texObj->getType());
			fboAttachment.level			= level;
			fboAttachment.layer			= layer;

			DE_ASSERT(fboAttachment.texTarget != Framebuffer::TEXTARGET_LAST);

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}